

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

ON_String __thiscall ON_String::ToUTF8(ON_String *this)

{
  char *pcVar1;
  bool bVar2;
  ON_Internal_Empty_aString *pOVar3;
  ON_String *in_RSI;
  char *pcVar4;
  
  pcVar1 = in_RSI->m_s;
  pOVar3 = (ON_Internal_Empty_aString *)(pcVar1 + -0xc);
  if (pcVar1 == (char *)0x0) {
    pOVar3 = &empty_astring;
  }
  pcVar4 = (char *)0x0;
  if (0 < (pOVar3->header).string_capacity) {
    pcVar4 = pcVar1;
  }
  bVar2 = IsPossibleEncoding(UTF8,pcVar4,(pOVar3->header).string_length);
  if (bVar2) {
    ON_String(this,in_RSI);
  }
  else {
    pcVar1 = in_RSI->m_s;
    pOVar3 = (ON_Internal_Empty_aString *)(pcVar1 + -0xc);
    if (pcVar1 == (char *)0x0) {
      pOVar3 = &empty_astring;
    }
    pcVar4 = (char *)0x0;
    if (0 < (pOVar3->header).string_capacity) {
      pcVar4 = pcVar1;
    }
    ToUTF8(this,pcVar4,(pOVar3->header).string_length);
  }
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_String::ToUTF8() const
{
  if (IsPossibleEncoding(ON_String::Encoding::UTF8))
    return *this;
  return ON_String::ToUTF8( this->Array(), this->Length() );
}